

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O0

stumpless_entry * stumpless_set_entry_app_name(stumpless_entry *entry,char *app_name)

{
  _Bool _Var1;
  size_t local_28;
  size_t name_length;
  char *app_name_local;
  stumpless_entry *entry_local;
  
  name_length = (size_t)app_name;
  app_name_local = (char *)entry;
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
    entry_local = (stumpless_entry *)0x0;
  }
  else {
    if ((app_name != (char *)0x0) && (_Var1 = validate_app_name(app_name,&local_28), !_Var1)) {
      return (stumpless_entry *)0x0;
    }
    lock_entry((stumpless_entry *)app_name_local);
    if (name_length == 0) {
      app_name_local[0x1d8] = '\x01';
      app_name_local[0x1d9] = '\0';
      app_name_local[0x1da] = '\0';
      app_name_local[0x1db] = '\0';
      app_name_local[0x1dc] = '\0';
      app_name_local[0x1dd] = '\0';
      app_name_local[0x1de] = '\0';
      app_name_local[0x1df] = '\0';
      app_name_local[0x1a4] = '-';
      app_name_local[0x1a5] = '\0';
    }
    else {
      *(size_t *)(app_name_local + 0x1d8) = local_28;
      memcpy(app_name_local + 0x1a4,(void *)name_length,local_28);
      app_name_local[local_28 + 0x1a4] = '\0';
    }
    unlock_entry((stumpless_entry *)app_name_local);
    clear_error();
    entry_local = (stumpless_entry *)app_name_local;
  }
  return entry_local;
}

Assistant:

struct stumpless_entry *
stumpless_set_entry_app_name( struct stumpless_entry *entry,
                              const char *app_name ) {
  size_t name_length;

  VALIDATE_ARG_NOT_NULL( entry );

  if( unlikely( app_name && !validate_app_name( app_name, &name_length ) ) ) {
    return NULL;
  }

  lock_entry( entry );
  if( app_name ) {
    entry->app_name_length = name_length;
    memcpy( entry->app_name, app_name, name_length );
    entry->app_name[name_length] = '\0';
  } else {
    entry->app_name_length = 1;
    entry->app_name[0] = '-';
    entry->app_name[1] = '\0';
  }
  unlock_entry( entry );

  clear_error(  );
  return entry;
}